

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_3537c6::Db::parseTemplateParam(Db *this)

{
  char *pcVar1;
  ForwardTemplateReference **__src;
  Node **ppNVar2;
  bool bVar3;
  char *pcVar4;
  Node *pNVar5;
  ForwardTemplateReference *pFVar6;
  ForwardTemplateReference **__dest;
  ForwardTemplateReference **ppFVar7;
  ulong uVar8;
  size_t __n;
  size_t local_38;
  
  pcVar4 = this->First;
  if ((pcVar4 != this->Last) && (*pcVar4 == 'T')) {
    pcVar1 = pcVar4 + 1;
    this->First = pcVar1;
    local_38 = 0;
    if ((pcVar1 == this->Last) || (*pcVar1 != '_')) {
      bVar3 = parsePositiveInteger(this,&local_38);
      if (bVar3) {
        return (Node *)0x0;
      }
      pcVar4 = this->First;
      if (pcVar4 == this->Last) {
        return (Node *)0x0;
      }
      if (*pcVar4 != '_') {
        return (Node *)0x0;
      }
      uVar8 = local_38 + 1;
      pcVar4 = pcVar4 + 1;
    }
    else {
      pcVar4 = pcVar4 + 2;
      uVar8 = 0;
    }
    this->First = pcVar4;
    if (this->ParsingLambdaParams == true) {
      pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar5->K = KNameType;
      pNVar5->RHSComponentCache = No;
      pNVar5->ArrayCache = No;
      pNVar5->FunctionCache = No;
      pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d36f0;
      pNVar5[1]._vptr_Node = (_func_int **)"auto";
      *(char **)&pNVar5[1].K = "";
      return pNVar5;
    }
    if (this->PermitForwardTemplateReferences == true) {
      pFVar6 = (ForwardTemplateReference *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      (pFVar6->super_Node).K = KForwardTemplateReference;
      (pFVar6->super_Node).RHSComponentCache = Unknown;
      (pFVar6->super_Node).ArrayCache = Unknown;
      (pFVar6->super_Node).FunctionCache = Unknown;
      (pFVar6->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d3748;
      pFVar6->Index = uVar8;
      pFVar6->Ref = (Node *)0x0;
      pFVar6->Printing = false;
      ppFVar7 = (this->ForwardTemplateRefs).Last;
      if (ppFVar7 == (this->ForwardTemplateRefs).Cap) {
        __src = (this->ForwardTemplateRefs).First;
        __n = (long)ppFVar7 - (long)__src;
        if (__src == (this->ForwardTemplateRefs).Inline) {
          __dest = (ForwardTemplateReference **)malloc(__n * 2);
          if (__dest == (ForwardTemplateReference **)0x0) goto LAB_0018c2ba;
          if (ppFVar7 != __src) {
            memmove(__dest,__src,__n);
          }
          (this->ForwardTemplateRefs).First = __dest;
        }
        else {
          __dest = (ForwardTemplateReference **)realloc(__src,__n * 2);
          (this->ForwardTemplateRefs).First = __dest;
          if (__dest == (ForwardTemplateReference **)0x0) {
LAB_0018c2ba:
            std::terminate();
          }
        }
        ppFVar7 = (ForwardTemplateReference **)((long)__dest + __n);
        (this->ForwardTemplateRefs).Cap = __dest + ((long)__n >> 2);
      }
      (this->ForwardTemplateRefs).Last = ppFVar7 + 1;
      *ppFVar7 = pFVar6;
      ppFVar7 = (this->ForwardTemplateRefs).Last;
      if (ppFVar7 == (this->ForwardTemplateRefs).First) {
        __assert_fail("Last != First && \"Calling back() on empty vector!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                      ,0x78a,
                      "T &(anonymous namespace)::PODSmallVector<(anonymous namespace)::ForwardTemplateReference *, 4>::back() [T = (anonymous namespace)::ForwardTemplateReference *, N = 4]"
                     );
      }
      return &ppFVar7[-1]->super_Node;
    }
    ppNVar2 = (this->TemplateParams).First;
    if (uVar8 < (ulong)((long)(this->TemplateParams).Last - (long)ppNVar2 >> 3)) {
      return ppNVar2[uVar8];
    }
  }
  return (Node *)0x0;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }